

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int resolveCompoundOrderBy(Parse *pParse,Select *pSelect)

{
  byte *pbVar1;
  uint uVar2;
  Expr *pEVar3;
  bool bVar4;
  Select *pSVar5;
  int iVar6;
  Parse *pPVar7;
  sqlite3 *psVar8;
  Select *pSVar9;
  int iVar10;
  Expr *pEVar11;
  long lVar12;
  ExprList_item *pEVar13;
  Expr *pE;
  Expr *pEVar14;
  ulong uVar15;
  int iVar16;
  Expr *p;
  ExprList_item *pEVar17;
  ExprList *pEVar18;
  int iCol;
  int local_78;
  int local_74;
  Parse *local_70;
  sqlite3 *local_68;
  Select *local_60;
  ExprList *local_58;
  Parse *local_50;
  ExprList_item *local_48;
  Token local_40;
  
  pEVar18 = pSelect->pOrderBy;
  if (pEVar18 == (ExprList *)0x0) {
    return 0;
  }
  local_68 = pParse->db;
  uVar2 = pEVar18->nExpr;
  if (local_68->aLimit[2] < (int)uVar2) {
    sqlite3ErrorMsg(pParse,"too many terms in ORDER BY clause");
  }
  else {
    if (0 < (int)uVar2) {
      lVar12 = 0;
      do {
        pbVar1 = &pEVar18->a[0].fg.field_0x1 + lVar12;
        *pbVar1 = *pbVar1 & 0xfb;
        lVar12 = lVar12 + 0x18;
      } while ((ulong)uVar2 * 0x18 != lVar12);
    }
    pSelect->pNext = (Select *)0x0;
    pSVar9 = pSelect->pPrior;
    while (pSVar5 = pSVar9, pSVar5 != (Select *)0x0) {
      pSVar5->pNext = pSelect;
      pSelect = pSVar5;
      pSVar9 = pSVar5->pPrior;
    }
    local_48 = pEVar18->a;
    iVar16 = 1;
    local_70 = pParse;
    local_58 = pEVar18;
    do {
      if ((pSelect == (Select *)0x0) || (iVar16 == 0)) {
        if ((long)pEVar18->nExpr < 1) {
          return 0;
        }
        uVar15 = 1;
        lVar12 = 0;
        do {
          if (((&pEVar18->a[0].fg.field_0x1)[lVar12] & 4) == 0) {
            sqlite3ErrorMsg(local_70,"%r ORDER BY term does not match any column in the result set",
                            uVar15);
            return 1;
          }
          uVar15 = (ulong)((int)uVar15 + 1);
          lVar12 = lVar12 + 0x18;
        } while ((long)pEVar18->nExpr * 0x18 != lVar12);
        return 0;
      }
      local_60 = pSelect;
      if (pEVar18->nExpr < 1) {
        local_74 = 0;
      }
      else {
        local_50 = (Parse *)pSelect->pEList;
        iVar16 = 0;
        local_74 = 0;
        pEVar17 = local_48;
        do {
          local_78 = -1;
          iVar10 = 0xb;
          if (((ulong)((anon_union_8_2_a01b6dbf_for_x *)&pEVar17->fg)->pList & 0x400) == 0) {
            p = pEVar17->pExpr;
            while ((p != (Expr *)0x0 && ((p->flags & 0x82000) != 0))) {
              if ((p->flags >> 0x13 & 1) == 0) {
                pEVar13 = (ExprList_item *)&p->pLeft;
              }
              else {
                pEVar13 = ((p->x).pList)->a;
              }
              p = pEVar13->pExpr;
            }
            if (p == (Expr *)0x0) goto LAB_0018fb01;
            iVar10 = sqlite3ExprIsInteger(p,&local_78);
            if (iVar10 == 0) {
              local_78 = resolveAsName(local_50,(ExprList *)p,pE);
              psVar8 = local_68;
              if (local_78 == 0) {
                pEVar11 = exprDup(local_68,p,0,(u8 **)0x0);
                pPVar7 = local_70;
                if (((psVar8->mallocFailed == '\0') &&
                    (local_78 = resolveOrderByTermToExprList(local_70,local_60,pEVar11),
                    1 < pPVar7->eParseMode)) && (0 < local_78)) {
                  resolveOrderByTermToExprList(local_70,local_60,p);
                }
                if (pEVar11 != (Expr *)0x0) {
                  sqlite3ExprDeleteNN(local_68,pEVar11);
                }
              }
            }
            else if ((local_78 < 1) || (*(int *)&local_50->db < local_78)) {
              resolveOutOfRangeError(local_70,"ORDER",iVar16 + 1,*(int *)&local_50->db,p);
              iVar10 = 1;
              goto LAB_0018fb01;
            }
            iVar6 = local_78;
            iVar10 = 0;
            bVar4 = true;
            if (local_78 < 1) {
              local_74 = 1;
              pEVar18 = local_58;
            }
            else {
              if (local_70->eParseMode < 2) {
                local_40.z = (char *)0x0;
                local_40.n = 0;
                pEVar11 = sqlite3ExprAlloc(local_68,0x9b,&local_40,0);
                if (pEVar11 == (Expr *)0x0) {
                  iVar10 = 1;
                  bVar4 = false;
                  pEVar18 = local_58;
                  goto LAB_0018fb04;
                }
                pbVar1 = (byte *)((long)&pEVar11->flags + 1);
                *pbVar1 = *pbVar1 | 8;
                (pEVar11->u).iValue = iVar6;
                pEVar13 = pEVar17;
                pEVar3 = pEVar17->pExpr;
                if (pEVar17->pExpr != p) {
                  do {
                    pEVar14 = pEVar3;
                    pEVar3 = pEVar14->pLeft;
                  } while (pEVar3->op == 'q');
                  pEVar13 = (ExprList_item *)&pEVar14->pLeft;
                }
                pEVar13->pExpr = pEVar11;
                sqlite3ExprDeleteNN(local_68,p);
                (pEVar17->u).x.iOrderByCol = (u16)local_78;
              }
              pbVar1 = (byte *)((long)&pEVar17->fg + 1);
              *pbVar1 = *pbVar1 | 4;
              pEVar18 = local_58;
              iVar10 = 0;
            }
          }
          else {
LAB_0018fb01:
            bVar4 = false;
          }
LAB_0018fb04:
          if ((iVar10 != 0xb) && (pSelect = local_60, iVar10 != 0)) goto LAB_0018fc68;
          iVar16 = iVar16 + 1;
          pEVar17 = pEVar17 + 1;
        } while (iVar16 < pEVar18->nExpr);
      }
      bVar4 = true;
      pSelect = local_60->pNext;
LAB_0018fc68:
      iVar16 = local_74;
    } while (bVar4);
  }
  return 1;
}

Assistant:

static int resolveCompoundOrderBy(
  Parse *pParse,        /* Parsing context.  Leave error messages here */
  Select *pSelect       /* The SELECT statement containing the ORDER BY */
){
  int i;
  ExprList *pOrderBy;
  ExprList *pEList;
  sqlite3 *db;
  int moreToDo = 1;

  pOrderBy = pSelect->pOrderBy;
  if( pOrderBy==0 ) return 0;
  db = pParse->db;
  if( pOrderBy->nExpr>db->aLimit[SQLITE_LIMIT_COLUMN] ){
    sqlite3ErrorMsg(pParse, "too many terms in ORDER BY clause");
    return 1;
  }
  for(i=0; i<pOrderBy->nExpr; i++){
    pOrderBy->a[i].fg.done = 0;
  }
  pSelect->pNext = 0;
  while( pSelect->pPrior ){
    pSelect->pPrior->pNext = pSelect;
    pSelect = pSelect->pPrior;
  }
  while( pSelect && moreToDo ){
    struct ExprList_item *pItem;
    moreToDo = 0;
    pEList = pSelect->pEList;
    assert( pEList!=0 );
    for(i=0, pItem=pOrderBy->a; i<pOrderBy->nExpr; i++, pItem++){
      int iCol = -1;
      Expr *pE, *pDup;
      if( pItem->fg.done ) continue;
      pE = sqlite3ExprSkipCollateAndLikely(pItem->pExpr);
      if( NEVER(pE==0) ) continue;
      if( sqlite3ExprIsInteger(pE, &iCol) ){
        if( iCol<=0 || iCol>pEList->nExpr ){
          resolveOutOfRangeError(pParse, "ORDER", i+1, pEList->nExpr, pE);
          return 1;
        }
      }else{
        iCol = resolveAsName(pParse, pEList, pE);
        if( iCol==0 ){
          /* Now test if expression pE matches one of the values returned
          ** by pSelect. In the usual case this is done by duplicating the
          ** expression, resolving any symbols in it, and then comparing
          ** it against each expression returned by the SELECT statement.
          ** Once the comparisons are finished, the duplicate expression
          ** is deleted.
          **
          ** If this is running as part of an ALTER TABLE operation and
          ** the symbols resolve successfully, also resolve the symbols in the
          ** actual expression. This allows the code in alter.c to modify
          ** column references within the ORDER BY expression as required.  */
          pDup = sqlite3ExprDup(db, pE, 0);
          if( !db->mallocFailed ){
            assert(pDup);
            iCol = resolveOrderByTermToExprList(pParse, pSelect, pDup);
            if( IN_RENAME_OBJECT && iCol>0 ){
              resolveOrderByTermToExprList(pParse, pSelect, pE);
            }
          }
          sqlite3ExprDelete(db, pDup);
        }
      }
      if( iCol>0 ){
        /* Convert the ORDER BY term into an integer column number iCol,
        ** taking care to preserve the COLLATE clause if it exists. */
        if( !IN_RENAME_OBJECT ){
          Expr *pNew = sqlite3Expr(db, TK_INTEGER, 0);
          if( pNew==0 ) return 1;
          pNew->flags |= EP_IntValue;
          pNew->u.iValue = iCol;
          if( pItem->pExpr==pE ){
            pItem->pExpr = pNew;
          }else{
            Expr *pParent = pItem->pExpr;
            assert( pParent->op==TK_COLLATE );
            while( pParent->pLeft->op==TK_COLLATE ) pParent = pParent->pLeft;
            assert( pParent->pLeft==pE );
            pParent->pLeft = pNew;
          }
          sqlite3ExprDelete(db, pE);
          pItem->u.x.iOrderByCol = (u16)iCol;
        }
        pItem->fg.done = 1;
      }else{
        moreToDo = 1;
      }
    }
    pSelect = pSelect->pNext;
  }
  for(i=0; i<pOrderBy->nExpr; i++){
    if( pOrderBy->a[i].fg.done==0 ){
      sqlite3ErrorMsg(pParse, "%r ORDER BY term does not match any "
            "column in the result set", i+1);
      return 1;
    }
  }
  return 0;
}